

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void Rescale(CPpmd7 *p)

{
  CPpmd_Void_Ref *pCVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined4 uVar5;
  CPpmd_State_Ref CVar6;
  CPpmd_State *pCVar7;
  Byte BVar8;
  Byte BVar9;
  UInt16 UVar10;
  UInt16 UVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  uint uVar14;
  Byte *pBVar15;
  CPpmd7_Context *pCVar16;
  uint uVar17;
  Byte *pBVar18;
  uint uVar19;
  uint uVar20;
  UInt32 n;
  int iVar21;
  byte bVar22;
  CPpmd_State *pCVar23;
  long lVar24;
  ulong uVar25;
  UInt16 UVar26;
  CPpmd_State *pCVar27;
  CPpmd_State *ptr;
  uint uVar28;
  bool bVar29;
  CPpmd_State tmp;
  
  pCVar7 = p->FoundState;
  ptr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar26 = pCVar7->SuccessorHigh;
  BVar8 = pCVar7->Symbol;
  BVar9 = pCVar7->Freq;
  UVar10 = pCVar7->SuccessorLow;
  for (pBVar15 = &pCVar7->Freq; pCVar7 = (CPpmd_State *)(pBVar15 + -1), pCVar7 != ptr;
      pBVar15 = pBVar15 + -6) {
    *(UInt16 *)(pBVar15 + 3) = *(UInt16 *)(pBVar15 + -3);
    uVar5 = *(undefined4 *)(pBVar15 + -7);
    pCVar7->Symbol = (char)uVar5;
    pCVar7->Freq = (char)((uint)uVar5 >> 8);
    pCVar7->SuccessorLow = (short)((uint)uVar5 >> 0x10);
  }
  *(UInt16 *)(pBVar15 + 3) = UVar26;
  pCVar23 = (CPpmd_State *)(pBVar15 + -1);
  pCVar23->Symbol = BVar8;
  pCVar23->Freq = BVar9;
  pCVar23->SuccessorLow = UVar10;
  pCVar16 = p->MinContext;
  uVar4 = pCVar16->SummFreq;
  bVar2 = *pBVar15;
  bVar29 = p->OrderFall != 0;
  uVar20 = (bVar2 + 4 & 0xff) + (uint)bVar29 >> 1;
  *pBVar15 = (byte)uVar20;
  iVar21 = pCVar16->NumStats - 1;
  uVar28 = (uint)uVar4 - (uint)bVar2;
  do {
    uVar19 = uVar28;
    pCVar23 = pCVar7;
    pBVar18 = pBVar15;
    bVar2 = pCVar23[1].Freq;
    uVar14 = (uint)bVar2 + (uint)bVar29 >> 1;
    bVar22 = (byte)uVar14;
    pCVar23[1].Freq = bVar22;
    if (pCVar23->Freq < uVar14) {
      bVar3 = pCVar23[1].Symbol;
      UVar26 = pCVar23[1].SuccessorLow;
      UVar10 = pCVar23[1].SuccessorHigh;
      pCVar7 = pCVar23;
      do {
        pCVar27 = pCVar7;
        pCVar27[1].SuccessorHigh = pCVar27->SuccessorHigh;
        BVar8 = pCVar27->Freq;
        UVar11 = pCVar27->SuccessorLow;
        pCVar27[1].Symbol = pCVar27->Symbol;
        pCVar27[1].Freq = BVar8;
        pCVar27[1].SuccessorLow = UVar11;
        if (pCVar27 == ptr) break;
        pCVar7 = pCVar27 + -1;
      } while (pCVar27[-1].Freq < bVar22);
      pCVar27->Symbol = bVar3;
      pCVar27->Freq = bVar22;
      pCVar27->SuccessorLow = UVar26;
      pCVar27->SuccessorHigh = UVar10;
    }
    uVar28 = uVar19 - bVar2;
    uVar20 = uVar20 + uVar14;
    iVar21 = iVar21 + -1;
    pBVar15 = pBVar18 + 6;
    pCVar7 = pCVar23 + 1;
  } while (iVar21 != 0);
  pCVar16 = p->MinContext;
  if (pCVar23[1].Freq == '\0') {
    uVar17 = (uint)pCVar16->NumStats;
    uVar28 = uVar19 - bVar2;
    uVar14 = uVar17;
    do {
      uVar14 = uVar14 - 1;
      uVar28 = uVar28 + 1;
      bVar2 = *pBVar18;
      pBVar18 = pBVar18 + -6;
    } while (bVar2 == 0);
    UVar26 = (UInt16)uVar14;
    pCVar16->NumStats = UVar26;
    if (UVar26 == 1) {
      bVar2 = ptr->Symbol;
      bVar22 = ptr->Freq;
      CVar6 = *(CPpmd_State_Ref *)&ptr->SuccessorLow;
      uVar14 = uVar28;
      do {
        bVar22 = bVar22 - (bVar22 >> 1);
        uVar28 = uVar14 >> 1;
        bVar29 = 3 < uVar14;
        uVar14 = uVar28;
      } while (bVar29);
      bVar3 = p->Units2Indx[(uVar17 + 1 >> 1) - 1];
      pCVar1 = p->FreeList + bVar3;
      uVar12 = *(undefined1 *)((long)pCVar1 + 1);
      uVar13 = *(undefined2 *)((long)pCVar1 + 2);
      ptr->Symbol = *(undefined1 *)pCVar1;
      ptr->Freq = uVar12;
      ptr->SuccessorLow = uVar13;
      p->FreeList[bVar3] = (int)ptr - *(int *)&p->Base;
      p->FoundState = (CPpmd_State *)&pCVar16->SummFreq;
      *(byte *)&pCVar16->SummFreq = bVar2;
      *(byte *)((long)&pCVar16->SummFreq + 1) = bVar22;
      pCVar16->Stats = CVar6;
    }
    else {
      uVar19 = uVar17 + 1 >> 1;
      uVar14 = (uVar14 & 0xffff) + 1 >> 1;
      if (uVar19 == uVar14) goto LAB_00363e5d;
      if (p->Units2Indx[uVar19 - 1] != p->Units2Indx[uVar14 - 1]) {
        uVar17 = (uint)p->Units2Indx[uVar14 - 1];
        uVar25 = (ulong)p->FreeList[uVar17];
        uVar19 = (uint)p->Units2Indx[uVar19 - 1];
        if (uVar25 == 0) {
          SplitBlock(p,ptr,uVar19,uVar17);
          pCVar16 = p->MinContext;
        }
        else {
          pBVar15 = p->Base;
          pCVar7 = (CPpmd_State *)(pBVar15 + uVar25);
          p->FreeList[uVar17] = *(CPpmd_Void_Ref *)(pBVar15 + uVar25);
          lVar24 = 0;
          do {
            *(undefined4 *)(&pCVar7->Symbol + lVar24) = *(undefined4 *)(&ptr->Symbol + lVar24);
            *(undefined4 *)((long)&pCVar7->SuccessorHigh + lVar24) =
                 *(undefined4 *)((long)&ptr->SuccessorHigh + lVar24);
            *(undefined4 *)((long)&pCVar7[1].SuccessorLow + lVar24) =
                 *(undefined4 *)((long)&ptr[1].SuccessorLow + lVar24);
            lVar24 = lVar24 + 0xc;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
          pCVar1 = p->FreeList + uVar19;
          uVar12 = *(undefined1 *)((long)pCVar1 + 1);
          uVar13 = *(undefined2 *)((long)pCVar1 + 2);
          ptr->Symbol = *(undefined1 *)pCVar1;
          ptr->Freq = uVar12;
          ptr->SuccessorLow = uVar13;
          p->FreeList[uVar19] = (int)ptr - (int)pBVar15;
          ptr = pCVar7;
        }
      }
      pCVar16->Stats = (int)ptr - *(int *)&p->Base;
    }
    if (UVar26 == 1) {
      return;
    }
    pCVar16 = p->MinContext;
  }
LAB_00363e5d:
  pCVar16->SummFreq = ((short)uVar20 + (short)uVar28) - (short)(uVar28 >> 1);
  p->FoundState = (CPpmd_State *)(p->Base + pCVar16->Stats);
  return;
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}